

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengineex.cpp
# Opt level: O2

QDebug * operator<<(QDebug *s,QVectorPath *path)

{
  long lVar1;
  QDebug *pQVar2;
  long in_FS_OFFSET;
  QDebug local_68;
  QDebug local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)s);
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  local_58 = 0xffffffff;
  uStack_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  QVectorPath::controlPointRect(path);
  pQVar2 = QDebug::operator<<(s,"QVectorPath(size:");
  pQVar2 = QDebug::operator<<(pQVar2,path->m_count);
  pQVar2 = QDebug::operator<<(pQVar2," hints:");
  Qt::hex(&pQVar2->stream->ts);
  pQVar2 = QDebug::operator<<(pQVar2,path->m_hints);
  local_68.stream = pQVar2->stream;
  (local_68.stream)->ref = (local_68.stream)->ref + 1;
  operator<<((QDebug *)&local_60,(QRectF *)&local_68);
  QDebug::operator<<(&local_60,')');
  QDebug::~QDebug(&local_60);
  QDebug::~QDebug(&local_68);
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDebug Q_GUI_EXPORT &operator<<(QDebug &s, const QVectorPath &path)
{
    QDebugStateSaver saver(s);
    QRectF rf = path.controlPointRect();
    s << "QVectorPath(size:" << path.elementCount()
      << " hints:" << Qt::hex << path.hints()
      << rf << ')';
    return s;
}